

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O1

void copy_and_extend_plane
               (uint8_t *src,int src_pitch,uint8_t *dst,int dst_pitch,int w,int h,int extend_top,
               int extend_left,int extend_bottom,int extend_right,int chroma_step)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  uint8_t *puVar4;
  size_t __n;
  size_t __n_00;
  uint8_t *puVar5;
  uint8_t *__s;
  byte *local_88;
  
  __n_00 = (size_t)extend_left;
  if (0 < h) {
    puVar4 = dst + w;
    local_88 = src + (w + -1) * chroma_step;
    iVar3 = 0;
    puVar5 = dst;
    __s = dst + -__n_00;
    do {
      memset(__s,(uint)*src,__n_00);
      if (chroma_step == 1) {
        memcpy(__s + __n_00,src,(long)w);
      }
      else if (0 < w) {
        uVar1 = 0;
        do {
          puVar5[uVar1] = src[uVar1 * 2];
          uVar1 = uVar1 + 1;
        } while ((uint)w != uVar1);
      }
      memset(puVar4,(uint)*local_88,(long)extend_right);
      src = src + src_pitch;
      local_88 = local_88 + src_pitch;
      __s = __s + dst_pitch;
      puVar4 = puVar4 + dst_pitch;
      iVar3 = iVar3 + 1;
      puVar5 = puVar5 + dst_pitch;
    } while (iVar3 != h);
  }
  lVar2 = -__n_00;
  __n = (size_t)(extend_left + w + extend_right);
  if (0 < extend_top) {
    puVar4 = dst + -(dst_pitch * extend_top) + lVar2;
    do {
      memcpy(puVar4,dst + -__n_00,__n);
      puVar4 = puVar4 + dst_pitch;
      extend_top = extend_top + -1;
    } while (extend_top != 0);
  }
  if (0 < extend_bottom) {
    puVar4 = dst + lVar2 + h * dst_pitch;
    do {
      memcpy(puVar4,dst + lVar2 + (h + -1) * dst_pitch,__n);
      puVar4 = puVar4 + dst_pitch;
      extend_bottom = extend_bottom + -1;
    } while (extend_bottom != 0);
  }
  return;
}

Assistant:

static void copy_and_extend_plane(const uint8_t *src, int src_pitch,
                                  uint8_t *dst, int dst_pitch, int w, int h,
                                  int extend_top, int extend_left,
                                  int extend_bottom, int extend_right,
                                  int chroma_step) {
  int i, linesize;
  // copy the left and right most columns out
  const uint8_t *src_ptr1 = src;
  const uint8_t *src_ptr2 = src + (w - 1) * chroma_step;
  uint8_t *dst_ptr1 = dst - extend_left;
  uint8_t *dst_ptr2 = dst + w;

  for (i = 0; i < h; i++) {
    memset(dst_ptr1, src_ptr1[0], extend_left);
    if (chroma_step == 1) {
      memcpy(dst_ptr1 + extend_left, src_ptr1, w);
    } else {
      for (int j = 0; j < w; j++) {
        dst_ptr1[extend_left + j] = src_ptr1[chroma_step * j];
      }
    }
    memset(dst_ptr2, src_ptr2[0], extend_right);
    src_ptr1 += src_pitch;
    src_ptr2 += src_pitch;
    dst_ptr1 += dst_pitch;
    dst_ptr2 += dst_pitch;
  }

  // Now copy the top and bottom lines into each line of the respective
  // borders
  src_ptr1 = dst - extend_left;
  src_ptr2 = dst + dst_pitch * (h - 1) - extend_left;
  dst_ptr1 = dst + dst_pitch * (-extend_top) - extend_left;
  dst_ptr2 = dst + dst_pitch * (h)-extend_left;
  linesize = extend_left + extend_right + w;
  assert(linesize <= dst_pitch);

  for (i = 0; i < extend_top; i++) {
    memcpy(dst_ptr1, src_ptr1, linesize);
    dst_ptr1 += dst_pitch;
  }

  for (i = 0; i < extend_bottom; i++) {
    memcpy(dst_ptr2, src_ptr2, linesize);
    dst_ptr2 += dst_pitch;
  }
}